

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

uint8_t * skip_aux(uint8_t *s)

{
  int iVar1;
  uint32_t n;
  int size;
  uint8_t *s_local;
  
  iVar1 = aux_type2size(*s);
  _n = s + 1;
  if (iVar1 != 0) {
    if (iVar1 == 0x42) {
      iVar1 = aux_type2size(*_n);
      s_local = s + (ulong)(uint)(iVar1 * *(int *)(s + 2)) + 6;
    }
    else if ((iVar1 == 0x48) || (iVar1 == 0x5a)) {
      for (; *_n != '\0'; _n = _n + 1) {
      }
      s_local = _n + 1;
    }
    else {
      s_local = _n + iVar1;
    }
    return s_local;
  }
  abort();
}

Assistant:

static inline uint8_t *skip_aux(uint8_t *s)
{
    int size = aux_type2size(*s); ++s; // skip type
    uint32_t n;
    switch (size) {
    case 'Z':
    case 'H':
        while (*s) ++s;
        return s + 1;
    case 'B':
        size = aux_type2size(*s); ++s;
        memcpy(&n, s, 4); s += 4;
        return s + size * n;
    case 0:
        abort();
        break;
    default:
        return s + size;
    }
}